

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CIrrDeviceSDL.cpp
# Opt level: O2

uint __thiscall irr::CIrrDeviceSDL::sleep(CIrrDeviceSDL *this,uint __seconds)

{
  ITimer *pIVar1;
  int iVar2;
  uint uVar3;
  char in_DL;
  
  pIVar1 = (this->super_CIrrDeviceStub).Timer;
  if (pIVar1 != (ITimer *)0x0) {
    iVar2 = (*pIVar1->_vptr_ITimer[7])();
    if (in_DL == '\x01' && (char)iVar2 == '\0') {
      (*((this->super_CIrrDeviceStub).Timer)->_vptr_ITimer[3])();
      SDL_Delay(__seconds);
      uVar3 = (*((this->super_CIrrDeviceStub).Timer)->_vptr_ITimer[4])();
      return uVar3;
    }
  }
  uVar3 = SDL_Delay(__seconds);
  return uVar3;
}

Assistant:

void CIrrDeviceSDL::sleep(u32 timeMs, bool pauseTimer)
{
	const bool wasStopped = Timer ? Timer->isStopped() : true;
	if (pauseTimer && !wasStopped)
		Timer->stop();

	SDL_Delay(timeMs);

	if (pauseTimer && !wasStopped)
		Timer->start();
}